

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O2

int oonf_log_register_source(char *name)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char **ppcVar5;
  ulong uVar6;
  
  sVar3 = _source_count;
  ppcVar5 = LOG_SOURCE_NAMES;
  for (uVar6 = 0; sVar3 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = strcmp(name,*ppcVar5);
    if (iVar1 == 0) {
      sVar3 = uVar6 & 0xffffffff;
      goto LAB_001492f9;
    }
    ppcVar5 = ppcVar5 + 1;
  }
  if (sVar3 == 0x80) {
    sVar3 = 1;
    if ((log_global_mask[2] & 4) == 0) goto LAB_001492f9;
    pcVar4 = "Maximum number of logging sources reached, cannot allocate %s";
    iVar1 = 0xd5;
  }
  else {
    pcVar4 = strdup(name);
    LOG_SOURCE_NAMES[sVar3] = pcVar4;
    if (pcVar4 != (char *)0x0) {
      _source_count = sVar3 + 1;
      sVar2 = strlen(name);
      if (_max_sourcetext_len < sVar2) {
        _max_sourcetext_len = sVar2;
      }
      goto LAB_001492f9;
    }
    sVar3 = 1;
    if ((log_global_mask[2] & 4) == 0) goto LAB_001492f9;
    pcVar4 = "Not enough memory for duplicating source name %s";
    iVar1 = 0xda;
  }
  sVar3 = 1;
  oonf_log(LOG_SEVERITY_WARN,LOG_LOGGING,"src/libcore/oonf_logging.c",iVar1,(void *)0x0,0,pcVar4,
           name);
LAB_001492f9:
  return (int)sVar3;
}

Assistant:

int
oonf_log_register_source(const char *name) {
  size_t i, len;

  /* maybe the source is already there ? */
  for (i = 0; i < _source_count; i++) {
    if (strcmp(name, LOG_SOURCE_NAMES[i]) == 0) {
      return i;
    }
  }

  if (i == LOG_MAXIMUM_SOURCES) {
    OONF_WARN(LOG_LOGGING,
      "Maximum number of logging sources reached,"
      " cannot allocate %s",
      name);
    return LOG_MAIN;
  }

  if ((LOG_SOURCE_NAMES[i] = strdup(name)) == NULL) {
    OONF_WARN(LOG_LOGGING, "Not enough memory for duplicating source name %s", name);
    return LOG_MAIN;
  }

  _source_count++;
  len = strlen(name);
  if (len > _max_sourcetext_len) {
    _max_sourcetext_len = len;
  }
  return i;
}